

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ForkBranchBase::~ForkBranchBase(ForkBranchBase *this)

{
  ForkBranchBase *pFVar1;
  ForkBranchBase ***pppFVar2;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_003a3808;
  if (this->prevPtr != (ForkBranchBase **)0x0) {
    pFVar1 = this->next;
    *this->prevPtr = pFVar1;
    pppFVar2 = &pFVar1->prevPtr;
    if (pFVar1 == (ForkBranchBase *)0x0) {
      pppFVar2 = &((this->hub).ptr)->tailBranch;
    }
    *pppFVar2 = this->prevPtr;
  }
  Own<kj::_::ForkHubBase>::dispose(&this->hub);
  return;
}

Assistant:

ForkBranchBase::~ForkBranchBase() noexcept(false) {
  if (prevPtr != nullptr) {
    // Remove from hub's linked list of branches.
    *prevPtr = next;
    (next == nullptr ? hub->tailBranch : next->prevPtr) = prevPtr;
  }
}